

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

void __thiscall DomWidget::~DomWidget(DomWidget *this)

{
  QList<DomProperty_*> *this_00;
  QList<DomProperty_*> *this_01;
  QList<DomRow_*> *this_02;
  QList<DomColumn_*> *this_03;
  QList<DomItem_*> *this_04;
  QList<DomLayout_*> *this_05;
  QList<DomWidget_*> *this_06;
  QList<DomAction_*> *this_07;
  QList<DomActionGroup_*> *this_08;
  const_iterator cVar1;
  const_iterator begin;
  const_iterator begin_00;
  const_iterator begin_01;
  const_iterator begin_02;
  const_iterator begin_03;
  const_iterator begin_04;
  const_iterator begin_05;
  const_iterator begin_06;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  Data *pDVar5;
  Data *pDVar6;
  Data *pDVar7;
  Data *pDVar8;
  Data *pDVar9;
  Data *pDVar10;
  Data *pDVar11;
  
  QList<QString>::clear(&this->m_class);
  this_00 = &this->m_property;
  cVar1.i = (this->m_property).d.ptr;
  qDeleteAll<QList<DomProperty*>::const_iterator>
            (cVar1,(const_iterator)(cVar1.i + (this->m_property).d.size));
  QList<DomProperty_*>::clear(this_00);
  this_01 = &this->m_attribute;
  cVar1.i = (this->m_attribute).d.ptr;
  qDeleteAll<QList<DomProperty*>::const_iterator>
            (cVar1,(const_iterator)(cVar1.i + (this->m_attribute).d.size));
  QList<DomProperty_*>::clear(this_01);
  this_02 = &this->m_row;
  begin.i = (this->m_row).d.ptr;
  qDeleteAll<QList<DomRow*>::const_iterator>(begin,(const_iterator)(begin.i + (this->m_row).d.size))
  ;
  QList<DomRow_*>::clear(this_02);
  this_03 = &this->m_column;
  begin_00.i = (this->m_column).d.ptr;
  qDeleteAll<QList<DomColumn*>::const_iterator>
            (begin_00,(const_iterator)(begin_00.i + (this->m_column).d.size));
  QList<DomColumn_*>::clear(this_03);
  this_04 = &this->m_item;
  begin_01.i = (this->m_item).d.ptr;
  qDeleteAll<QList<DomItem*>::const_iterator>
            (begin_01,(const_iterator)(begin_01.i + (this->m_item).d.size));
  QList<DomItem_*>::clear(this_04);
  this_05 = &this->m_layout;
  begin_02.i = (this->m_layout).d.ptr;
  qDeleteAll<QList<DomLayout*>::const_iterator>
            (begin_02,(const_iterator)(begin_02.i + (this->m_layout).d.size));
  QList<DomLayout_*>::clear(this_05);
  this_06 = &this->m_widget;
  begin_03.i = (this->m_widget).d.ptr;
  qDeleteAll<QList<DomWidget*>::const_iterator>
            (begin_03,(const_iterator)(begin_03.i + (this->m_widget).d.size));
  QList<DomWidget_*>::clear(this_06);
  this_07 = &this->m_action;
  begin_04.i = (this->m_action).d.ptr;
  qDeleteAll<QList<DomAction*>::const_iterator>
            (begin_04,(const_iterator)(begin_04.i + (this->m_action).d.size));
  QList<DomAction_*>::clear(this_07);
  this_08 = &this->m_actionGroup;
  begin_05.i = (this->m_actionGroup).d.ptr;
  qDeleteAll<QList<DomActionGroup*>::const_iterator>
            (begin_05,(const_iterator)(begin_05.i + (this->m_actionGroup).d.size));
  QList<DomActionGroup_*>::clear(this_08);
  begin_06.i = (this->m_addAction).d.ptr;
  qDeleteAll<QList<DomActionRef*>::const_iterator>
            (begin_06,(const_iterator)(begin_06.i + (this->m_addAction).d.size));
  QList<DomActionRef_*>::clear(&this->m_addAction);
  QList<QString>::clear(&this->m_zOrder);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_zOrder).d);
  pDVar2 = (this->m_addAction).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_addAction).d.d)->super_QArrayData,8,0x10);
    }
  }
  pDVar3 = (this_08->d).d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_08->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar4 = (this_07->d).d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_07->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar5 = (this_06->d).d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_06->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar6 = (this_05->d).d;
  if (pDVar6 != (Data *)0x0) {
    LOCK();
    (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_05->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar7 = (this_04->d).d;
  if (pDVar7 != (Data *)0x0) {
    LOCK();
    (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_04->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar8 = (this_03->d).d;
  if (pDVar8 != (Data *)0x0) {
    LOCK();
    (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_03->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar9 = (this_02->d).d;
  if (pDVar9 != (Data *)0x0) {
    LOCK();
    (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_02->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar10 = (this_01->d).d;
  if (pDVar10 != (Data *)0x0) {
    LOCK();
    (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_01->d).d)->super_QArrayData,8,0x10);
    }
  }
  pDVar10 = (this_00->d).d;
  if (pDVar10 != (Data *)0x0) {
    LOCK();
    (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_00->d).d)->super_QArrayData,8,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_class).d);
  pDVar11 = (this->m_attr_name).d.d;
  if (pDVar11 != (Data *)0x0) {
    LOCK();
    (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_attr_name).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar11 = (this->m_attr_class).d.d;
  if (pDVar11 != (Data *)0x0) {
    LOCK();
    (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->m_attr_class).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

DomWidget::~DomWidget()
{
    m_class.clear();
    qDeleteAll(m_property);
    m_property.clear();
    qDeleteAll(m_attribute);
    m_attribute.clear();
    qDeleteAll(m_row);
    m_row.clear();
    qDeleteAll(m_column);
    m_column.clear();
    qDeleteAll(m_item);
    m_item.clear();
    qDeleteAll(m_layout);
    m_layout.clear();
    qDeleteAll(m_widget);
    m_widget.clear();
    qDeleteAll(m_action);
    m_action.clear();
    qDeleteAll(m_actionGroup);
    m_actionGroup.clear();
    qDeleteAll(m_addAction);
    m_addAction.clear();
    m_zOrder.clear();
}